

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O3

CVmHashEntry * __thiscall CVmDynFuncMacros::find(CVmDynFuncMacros *this,char *sym,size_t len)

{
  ulong uVar1;
  ushort uVar2;
  uint self;
  anon_union_8_8_cb74652f_for_val aVar3;
  vm_val_t *pvVar4;
  vm_val_t *pvVar5;
  int iVar6;
  CVmHashEntry *pCVar7;
  ushort *lst;
  ushort *puVar8;
  ushort *lst_00;
  ushort *puVar9;
  CTcHashEntryPpDefine *this_00;
  ulong uVar10;
  char **local_b0;
  size_t *local_a8;
  vm_val_t ele;
  vm_val_t subele;
  vm_val_t symval;
  vm_val_t symstr;
  
  pCVar7 = CVmHashTable::find(&this->hash_,sym,len);
  if (pCVar7 != (CVmHashEntry *)0x0) {
    return pCVar7;
  }
  if (this->tab_ == 0) {
    return (CVmHashEntry *)0x0;
  }
  this_00 = (CTcHashEntryPpDefine *)0x0;
  symstr.val.obj = CVmObjString::create(0,sym,len);
  pvVar4 = sp_;
  symstr.typ = VM_OBJ;
  aVar3._4_4_ = symstr.val._4_4_;
  aVar3.obj = symstr.val.obj;
  pvVar5 = sp_ + 1;
  *(ulong *)sp_ = CONCAT44(symstr._4_4_,5);
  sp_ = pvVar5;
  pvVar4->val = aVar3;
  self = this->tab_;
  CVmObject::index_val_ov
            ((CVmObject *)
             ((long)&G_obj_table_X.pages_[self >> 0xc]->ptr_ + (ulong)((self & 0xfff) * 0x18)),
             &symval,self,&symstr);
  pvVar4 = sp_;
  sp_ = sp_ + 1;
  pvVar4->typ = symval.typ;
  *(undefined4 *)&pvVar4->field_0x4 = symval._4_4_;
  pvVar4->val = symval.val;
  lst = (ushort *)vm_val_t::get_as_list(&symval);
  if (lst == (ushort *)0x0) goto LAB_0027b8ac;
  if (2 < *lst) {
    CVmObjList::index_list(&ele,(char *)lst,1);
    puVar8 = (ushort *)vm_val_t::get_as_string(&ele);
    if (puVar8 != (ushort *)0x0) {
      CVmObjList::index_list(&ele,(char *)lst,2);
      lst_00 = (ushort *)vm_val_t::get_as_list(&ele);
      if (lst_00 != (ushort *)0x0) {
        uVar2 = *lst_00;
        if (uVar2 == 0) {
          local_b0 = (char **)0x0;
          local_a8 = (size_t *)0x0;
        }
        else {
          local_b0 = (char **)operator_new__((ulong)((uint)uVar2 * 8));
          local_a8 = (size_t *)operator_new__((ulong)((uint)uVar2 * 8));
          this_00 = (CTcHashEntryPpDefine *)0x0;
          uVar10 = 0;
          do {
            uVar1 = uVar10 + 1;
            CVmObjList::index_list(&subele,(char *)lst_00,(uint)uVar1);
            puVar9 = (ushort *)vm_val_t::get_as_string(&subele);
            if (puVar9 == (ushort *)0x0) goto LAB_0027b99d;
            local_b0[uVar10] = (char *)(puVar9 + 1);
            local_a8[uVar10] = (ulong)*puVar9;
            uVar10 = uVar1;
          } while (uVar2 != uVar1);
        }
        CVmObjList::index_list(&ele,(char *)lst,3);
        if (ele.typ == VM_INT) {
LAB_0027b91a:
          this_00 = (CTcHashEntryPpDefine *)operator_new(0x68);
          CTcHashEntryPpDefine::CTcHashEntryPpDefine
                    (this_00,sym,len,1,ele.val.obj & 1,(uint)uVar2,ele.val.obj >> 1 & 1,local_b0,
                     local_a8,(char *)(puVar8 + 1),(ulong)*puVar8);
          CVmHashTable::add(&this->hash_,(CVmHashEntry *)this_00);
        }
        else {
          iVar6 = vm_val_t::nonint_is_numeric(&ele);
          if (iVar6 != 0) {
            if (ele.typ != VM_INT) {
              ele.val.intval = vm_val_t::nonint_num_to_int(&ele);
            }
            goto LAB_0027b91a;
          }
          this_00 = (CTcHashEntryPpDefine *)0x0;
        }
        if (local_b0 != (char **)0x0) {
LAB_0027b99d:
          operator_delete__(local_b0);
        }
        if (local_a8 != (size_t *)0x0) {
          operator_delete__(local_a8);
        }
        goto LAB_0027b8ac;
      }
    }
  }
  this_00 = (CTcHashEntryPpDefine *)0x0;
LAB_0027b8ac:
  sp_ = sp_ + -2;
  return (CVmHashEntry *)this_00;
}

Assistant:

CVmHashEntry *find(const char *sym, size_t len)
    {
        CVmHashEntry *entry;
        
        /* first, check to see if it's our underlying table */
        entry = hash_.find(sym, len);
        if (entry != 0)
            return entry;

        /* if there's no user-code table, fail */
        if (tab_ == VM_INVALID_OBJ)
            return 0;

        /* establish access to globals */
        VMGLOB_PTR(globals_);

        /* create a string for the symbol name; stack it for gc protection */
        vm_val_t symstr;
        symstr.set_obj(CVmObjString::create(vmg_ FALSE, sym, len));
        G_stk->push(&symstr);

        /* look up the symbol string in the table */
        vm_val_t symval;
        vm_objp(vmg_ tab_)->index_val_ov(vmg_ &symval, tab_, &symstr);
        G_stk->push(&symval);

        /* it has to be a list, and it has to have at least three elements */
        const char *lst = symval.get_as_list(vmg0_);
        if (lst != 0 && vmb_get_len(lst) >= 3)
        {
            vm_val_t ele, subele;
            const char *exp, *arglst;
            uint flags = 0;
            int argc;
            const char **argv = 0;
            size_t *argvlen = 0;
            int i;
            
            /* the first element is the expansion string */
            CVmObjList::index_list(vmg_ &ele, lst, 1);
            if ((exp = ele.get_as_string(vmg0_)) == 0)
                goto done;

            /* the second element is the argument list */
            CVmObjList::index_list(vmg_ &ele, lst, 2);
            if ((arglst = ele.get_as_list(vmg0_)) == 0)
                goto done;

            /* figure the argument count */
            argc = vmb_get_len(arglst);

            /* build the argument vector */
            if (argc != 0)
            {
                /* allocate the string and length arrays */
                argv = new const char*[argc];
                argvlen = new size_t[argc];

                /* populate the arrays */
                for (i = 0 ; i < argc ; ++i)
                {
                    /* retrieve this argument name string */
                    CVmObjList::index_list(vmg_ &subele, arglst, i+1);
                    const char *n = subele.get_as_string(vmg0_);
                    if (n == 0)
                        goto done;

                    /* add it to the string and length arrays */
                    argv[i] = n + VMB_LEN;
                    argvlen[i] = vmb_get_len(n);
                }
            }

            /* the third element is the flags */
            CVmObjList::index_list(vmg_ &ele, lst, 3);
            if (!ele.is_numeric(vmg0_))
                goto done;
            flags = ele.num_to_int(vmg0_);

            /* create the entry */
            entry = new CTcHashEntryPpDefine(
                sym, len, TRUE, (flags & 1) != 0, argc, (flags & 2) != 0,
                argv, argvlen, exp + VMB_LEN, vmb_get_len(exp));

            /* add the entry to our cache */
            hash_.add(entry);

        done:
            /* free the argument list */
            if (argv != 0)
                delete [] argv;
            if (argvlen != 0)
                delete [] argvlen;
        }

        /* done with our gc protection */
        G_stk->discard(2);

        /* return what we found */
        return entry;
    }